

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshrec.c
# Opt level: O0

void t1_hints_open(T1_Hints hints)

{
  T1_Hints hints_local;
  
  ps_hints_open((PS_Hints)hints,PS_HINT_TYPE_1);
  return;
}

Assistant:

static void
  t1_hints_open( T1_Hints  hints )
  {
    ps_hints_open( (PS_Hints)hints, PS_HINT_TYPE_1 );
  }